

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

bool __thiscall storage::BTree::_erase_(BTree *this,int key,Record **out_record)

{
  int iVar1;
  BTree *pBVar2;
  bool bVar3;
  int iVar4;
  BTInnerNode *pBVar5;
  BTLeafNode *pBVar6;
  BTInnerNode *pBVar7;
  long lVar8;
  long lVar9;
  BTNode **ppBVar10;
  BTNode *pBVar11;
  bool err;
  int idx;
  bool err_1;
  BTNode *node;
  bool local_4d;
  int local_4c;
  bool local_45;
  undefined4 local_44;
  BTree *local_40;
  BTNode *local_38;
  
  pBVar11 = this->root_;
  if (pBVar11 == (BTNode *)0x0) {
    local_45 = false;
  }
  else {
    local_40 = this;
    local_38 = pBVar11;
    iVar4 = (**pBVar11->_vptr_BTNode)(pBVar11);
    if ((char)iVar4 == '\0') {
      do {
        pBVar5 = (BTInnerNode *)__dynamic_cast(pBVar11,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        BTInnerNode::search_node(pBVar5,key,&local_38);
        pBVar11 = local_38;
        iVar4 = (**local_38->_vptr_BTNode)(local_38);
      } while ((char)iVar4 == '\0');
    }
    pBVar2 = local_40;
    if (pBVar11 == local_40->root_) {
      pBVar6 = (BTLeafNode *)__dynamic_cast(pBVar11,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      iVar4 = (pBVar6->super_BTNode).used_links_count_;
      if (iVar4 < 3) {
        if (iVar4 != 2) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xd4,"bool storage::BTree::_erase_(int, Record *&)");
        }
        *out_record = pBVar6->record_links_[0];
        operator_delete(pBVar2->root_,0xe0);
        pBVar2->root_ = (BTNode *)0x0;
        local_45 = true;
      }
      else {
        local_45 = false;
        BTLeafNode::erase_(pBVar6,key,out_record,&local_45);
        if ((local_45 == false) && (*out_record != (Record *)0x0)) {
          __assert_fail("out_record == nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                        ,0xc9,"bool storage::BTree::_erase_(int, Record *&)");
        }
      }
    }
    else {
      local_4d = false;
      if (pBVar11->parent_ == (BTNode *)0x0) {
        pBVar5 = (BTInnerNode *)0x0;
      }
      else {
        pBVar5 = (BTInnerNode *)
                 __dynamic_cast(pBVar11->parent_,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      pBVar6 = (BTLeafNode *)__dynamic_cast(pBVar11,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      iVar4 = BTLeafNode::erase_(pBVar6,key,out_record,&local_4d);
      local_44 = CONCAT31((int3)((uint)iVar4 >> 8),local_4d);
      local_4c = iVar4;
      if (local_4d == true) {
        if (iVar4 != -1) {
          do {
            if (pBVar5 == (BTInnerNode *)0x0) {
              pBVar7 = (BTInnerNode *)0x0;
            }
            else {
              pBVar11 = pBVar5->links_[(long)iVar4 + 1];
              pBVar7 = BTInnerNode::erase_(pBVar5,iVar4,&local_4c);
              pBVar2 = local_40;
              iVar4 = local_4c;
              if (local_4c != -1 && pBVar7 == (BTInnerNode *)0x0) {
                if (pBVar5 != (BTInnerNode *)local_40->root_) {
                  __assert_fail("parent == root_",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                                ,0xe5,"bool storage::BTree::_erase_(int, Record *&)");
                }
                iVar1 = (pBVar5->super_BTNode).used_links_count_;
                if (iVar1 < 3) {
                  if (iVar1 != 2) {
                    __assert_fail("false",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                                  ,0x100,"bool storage::BTree::_erase_(int, Record *&)");
                  }
                  operator_delete(pBVar5->links_[1],0xe0);
                  pBVar11 = pBVar5->links_[0];
                  pBVar2->root_ = pBVar11;
                  pBVar11->parent_ = (BTNode *)0x0;
                  pBVar11->child_index_ = -1;
                  operator_delete(pBVar5,0x278);
                }
                else {
                  if (local_4c + 1 < iVar1 + -1) {
                    lVar8 = (long)local_4c + 6;
                    do {
                      (pBVar5->super_BTNode).keys_[lVar8 + -6] =
                           (pBVar5->super_BTNode).keys_[lVar8 + -5];
                      lVar9 = lVar8 + -4;
                      lVar8 = lVar8 + 1;
                    } while (lVar9 < (long)(pBVar5->super_BTNode).used_links_count_ + -1);
                  }
                  operator_delete(pBVar5->links_[local_4c + 1],0xe0);
                  iVar1 = (pBVar5->super_BTNode).used_links_count_;
                  if (iVar4 + 2 < iVar1) {
                    ppBVar10 = pBVar5->links_ + (iVar4 + 2);
                    do {
                      iVar4 = iVar4 + 1;
                      pBVar11 = *ppBVar10;
                      ppBVar10[-1] = pBVar11;
                      pBVar11->parent_ = &pBVar5->super_BTNode;
                      pBVar11->child_index_ = iVar4;
                      ppBVar10 = ppBVar10 + 1;
                    } while (iVar4 - iVar1 != -2);
                  }
                  (pBVar5->super_BTNode).used_links_count_ = iVar1 + -1;
                  bVar3 = ll(pBVar5->links_,iVar1 + -1);
                  if (!bVar3) {
                    __assert_fail("ll(cur->links_, cur->used_links_count_)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                                  ,0xf8,"bool storage::BTree::_erase_(int, Record *&)");
                  }
                }
                break;
              }
              operator_delete(pBVar11,0xe0);
            }
            pBVar5 = pBVar7;
          } while (iVar4 != -1);
        }
      }
      else if (*out_record != (Record *)0x0) {
        __assert_fail("out_record == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Raphael2017[P]BTree/btree.cpp"
                      ,0xdb,"bool storage::BTree::_erase_(int, Record *&)");
      }
      local_45 = SUB41(local_44,0);
    }
  }
  return local_45;
}

Assistant:

bool BTree::_erase_(int key, Record *&out_record) {
        if (!root_) {
            return false;   /* EMPTY */
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        if (node == root_) {
            auto leaf = dynamic_cast<BTLeafNode *>(node);
            if (leaf->key_count() > 1) {
                bool err = false;
                leaf->erase_(key, out_record, err);
                if (!err) {
                    assert(out_record == nullptr);
                    return false; // not exists
                } else
                    return true;

            } else if (leaf->key_count() == 1) {
                out_record = leaf->record_links_[0];
                delete root_;
                root_ = nullptr;
                return true;
            } else {
                assert(false);
            }
        }
        bool err = false;
        BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
        int idx = dynamic_cast<BTLeafNode *>(node)->erase_(key, out_record, err);
        if (!err) {
            assert(out_record == nullptr);
            return false; // not exists
        }

        BTInnerNode *cur = nullptr;
        while (idx != -1) {
            if (parent) {
                auto tt = parent->links_[idx + 1];
                BTInnerNode *nd = parent->erase_(idx, idx);
                if (!nd && idx != -1) {
                    assert(parent == root_);
                    cur = parent;
                    break;
                } else {
                    delete tt;
                    parent = nd;
                }
            }
        }
        if (cur) {
            if (cur->used_links_count_ > 2) {
                for (int i = idx + 1; i < cur->used_links_count_ - 1; ++i) {
                    cur->keys_[i - 1] = cur->keys_[i];
                }
                delete cur->links_[idx + 1];
                for (int i = idx + 2; i < cur->used_links_count_; ++i) {
                    cur->set_link(i - 1, cur->links_[i]);
                }
                cur->used_links_count_--;
                assert(ll(cur->links_, cur->used_links_count_));
            } else if (cur->used_links_count_ == 2) {
                delete cur->links_[1];
                root_ = cur->links_[0];
                root_->parent_ = nullptr;
                root_->child_index_ = -1;
                delete cur;
            } else {
                assert(false);
            }
        }
        return true;
    }